

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ExpandLinkItems
          (cmGeneratorTarget *this,string *prop,string *value,string *config,
          cmGeneratorTarget *headTarget,bool usage_requirements_only,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items,bool *hadHeadSensitiveCondition)

{
  cmLocalGenerator *lg;
  bool bVar1;
  string *target;
  cmCompiledGeneratorExpression *pcVar2;
  char *pcVar3;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  undefined1 local_160 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmListFileBacktrace local_78;
  undefined1 local_58 [8];
  cmGeneratorExpression ge;
  bool usage_requirements_only_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  string *value_local;
  string *prop_local;
  cmGeneratorTarget *this_local;
  
  ge.Backtrace.Cur._7_1_ = usage_requirements_only;
  cmListFileBacktrace::cmListFileBacktrace(&local_78);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_58,&local_78);
  cmListFileBacktrace::~cmListFileBacktrace(&local_78);
  target = GetName_abi_cxx11_(this);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)
             &libs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,target,prop,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  if ((ge.Backtrace.Cur._7_1_ & 1) != 0) {
    cmGeneratorExpressionDAGChecker::SetTransitivePropertiesOnly
              ((cmGeneratorExpressionDAGChecker *)
               &libs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cge);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_160,(string *)local_58);
  local_160._8_8_ = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_160);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_160 + 0x10),
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_160._8_8_);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_160);
  pcVar2 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_160 + 0x10));
  lg = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_1a0);
  pcVar3 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar2,lg,config,false,headTarget,this,
                      (cmGeneratorExpressionDAGChecker *)
                      &libs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,pcVar3,&local_1a1);
  cmSystemTools::ExpandListArgument
            (&local_180,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&cge,false);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_1a0);
  LookupLinkItems(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&cge,items);
  pcVar2 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_160 + 0x10));
  bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar2);
  *hadHeadSensitiveCondition = bVar1;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_160 + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&cge);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)
             &libs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  return;
}

Assistant:

void cmGeneratorTarget::ExpandLinkItems(
  std::string const& prop, std::string const& value, std::string const& config,
  cmGeneratorTarget const* headTarget, bool usage_requirements_only,
  std::vector<cmLinkItem>& items, bool& hadHeadSensitiveCondition) const
{
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), prop, CM_NULLPTR,
                                             CM_NULLPTR);
  // The $<LINK_ONLY> expression may be in a link interface to specify private
  // link dependencies that are otherwise excluded from usage requirements.
  if (usage_requirements_only) {
    dagChecker.SetTransitivePropertiesOnly();
  }
  std::vector<std::string> libs;
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(value);
  cmSystemTools::ExpandListArgument(cge->Evaluate(this->LocalGenerator, config,
                                                  false, headTarget, this,
                                                  &dagChecker),
                                    libs);
  this->LookupLinkItems(libs, items);
  hadHeadSensitiveCondition = cge->GetHadHeadSensitiveCondition();
}